

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O1

void __thiscall agge::tests::RendererTests::ScanlineIsOmittedIfCannotBegin(RendererTests *this)

{
  cell *pcVar1;
  bool bVar2;
  int iVar3;
  cell *pcVar4;
  cell *pcVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  scanline_cells sVar10;
  mask<8UL> mask;
  cell cells3 [2];
  cell cells2 [3];
  cell cells1 [3];
  scanline_cells cells [3];
  scanline_mockup local_180;
  string local_158;
  LocationInfo local_138;
  mask<8UL> local_110;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  cell local_a4;
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  cell local_74;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_68;
  undefined8 *local_58;
  cell *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  
  local_180.excepted_y = -1000000;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_180._25_8_ = 0;
  local_180._current_y = 0x7fffffff;
  local_68.second = &local_74;
  local_98._0_8_ = 0;
  local_88 = 0;
  uStack_7c = 0;
  local_98._8_8_ = 0xb00000011;
  uStack_84 = 0xfffffffd;
  uStack_80 = 0xd;
  local_78 = 0xfffffff2;
  local_50 = &local_a4;
  local_b8 = 0;
  uStack_ac = 0;
  local_c8 = 0xffffffff;
  uStack_c0 = 0x7000000aa;
  uStack_b4 = 0xfffffffd;
  uStack_b0 = 0x11;
  local_a8 = 0xffffff59;
  local_40 = local_d0;
  local_d8 = 0xffffff8b00000000;
  local_e8 = 0;
  uStack_e0 = 0xd00000075;
  local_68.first = (cell *)local_98;
  local_58 = &local_c8;
  local_48 = &local_e8;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,3>
            ((mask<8ul> *)&local_110,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [3])
             &local_68,0x1f);
  local_180.excepted_y = 0x20;
  if (0 < local_110._height) {
    iVar6 = local_110._height + local_110._min_y;
    iVar8 = local_110._min_y;
    do {
      sVar10 = mocks::mask<8UL>::operator[](&local_110,iVar8);
      pcVar5 = sVar10.second;
      pcVar4 = sVar10.first;
      bVar2 = anon_unknown_1::scanline_mockup::begin(&local_180,iVar8);
      if (bVar2) {
        if (pcVar4 != pcVar5) {
          uVar7 = 0;
LAB_0016eac5:
          iVar9 = pcVar4->x;
          iVar3 = 0;
          pcVar1 = pcVar4;
          do {
            pcVar4 = pcVar1 + 1;
            iVar3 = iVar3 + pcVar1->area;
            uVar7 = uVar7 + pcVar1->cover;
            if (pcVar4 == pcVar5) break;
            pcVar1 = pcVar4;
          } while (pcVar4->x == iVar9);
          if (iVar3 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_180,iVar9,uVar7 * 0x200 - iVar3);
            iVar9 = iVar9 + 1;
          }
          if (pcVar4 != pcVar5) {
            iVar3 = pcVar4->x - iVar9;
            if ((uVar7 & 0x7fffff) != 0 && iVar3 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_180,iVar9,iVar3,uVar7 * 0x200);
            }
            goto LAB_0016eac5;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_180);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < iVar6);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_158,0x250);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [3])&DAT_001a16c0,&local_180.spans_log,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
    operator_delete(local_138.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
       SUB81(local_180.spans_log.
             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_180.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
       (undefined7)
       ((ulong)local_180.spans_log.
               super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               ._M_impl.super__Vector_impl_data._M_start >> 8);
  local_180.excepted_y = 0x21;
  if (0 < local_110._height) {
    iVar8 = local_110._min_y;
    do {
      sVar10 = mocks::mask<8UL>::operator[](&local_110,iVar8);
      pcVar5 = sVar10.second;
      pcVar4 = sVar10.first;
      bVar2 = anon_unknown_1::scanline_mockup::begin(&local_180,iVar8);
      if (bVar2) {
        if (pcVar4 != pcVar5) {
          uVar7 = 0;
LAB_0016ec24:
          iVar6 = pcVar4->x;
          iVar9 = 0;
          pcVar1 = pcVar4;
          do {
            pcVar4 = pcVar1 + 1;
            iVar9 = iVar9 + pcVar1->area;
            uVar7 = uVar7 + pcVar1->cover;
            if (pcVar4 == pcVar5) break;
            pcVar1 = pcVar4;
          } while (pcVar4->x == iVar6);
          if (iVar9 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_180,iVar6,uVar7 * 0x200 - iVar9);
            iVar6 = iVar6 + 1;
          }
          if (pcVar4 != pcVar5) {
            iVar9 = pcVar4->x - iVar6;
            if ((uVar7 & 0x7fffff) != 0 && iVar9 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_180,iVar6,iVar9,uVar7 * 0x200);
            }
            goto LAB_0016ec24;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_180);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_110._height + local_110._min_y);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_158,0x25f);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,4ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [4])&DAT_001a16f0,&local_180.spans_log,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
    operator_delete(local_138.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_110._cells.
      super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110._cells.
                    super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_180.spans_log.
      super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.spans_log.
                    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}